

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O0

size_t spdlog::details::os::thread_id(void)

{
  char *pcVar1;
  size_t sVar2;
  size_t *psVar3;
  undefined1 *puVar4;
  
  pcVar1 = (char *)__tls_get_addr(&PTR_002c4cf8);
  if (*pcVar1 == '\0') {
    sVar2 = _thread_id();
    psVar3 = (size_t *)__tls_get_addr(&PTR_002c4dc8);
    *psVar3 = sVar2;
    puVar4 = (undefined1 *)__tls_get_addr(&PTR_002c4cf8);
    *puVar4 = 1;
  }
  psVar3 = (size_t *)__tls_get_addr(&PTR_002c4dc8);
  return *psVar3;
}

Assistant:

SPDLOG_INLINE size_t thread_id() SPDLOG_NOEXCEPT
{
#if defined(SPDLOG_NO_TLS)
    return _thread_id();
#else // cache thread id in tls
    static thread_local const size_t tid = _thread_id();
    return tid;
#endif
}